

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O1

void __thiscall AckThread::AckThread(AckThread *this,UdpSocket *socket)

{
  this->_socket = socket;
  pthread_mutex_init((pthread_mutex_t *)&this->_lock,(pthread_mutexattr_t *)0x0);
  (this->_wait_ack_sessions)._M_h._M_buckets = &(this->_wait_ack_sessions)._M_h._M_single_bucket;
  (this->_wait_ack_sessions)._M_h._M_bucket_count = 1;
  (this->_wait_ack_sessions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_wait_ack_sessions)._M_h._M_element_count = 0;
  (this->_wait_ack_sessions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_wait_ack_sessions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_wait_ack_sessions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->_max_ack_interval_microseconds = 4000;
  LOCK();
  (this->_running)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

AckThread::AckThread(UdpSocket* socket)
	: _socket(socket)
{
	_running = true;
}